

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cpp
# Opt level: O1

ssize_t __thiscall
diffusion::FileReader::read(FileReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t extraout_RAX;
  ErrorNoData *this_00;
  undefined4 in_register_00000034;
  
  iVar1 = (**(this->super_Reader)._vptr_Reader)();
  if ((char)iVar1 != '\0') {
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)CONCAT44(in_register_00000034,__fd),
               (this->data_queue_).
               super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::
    deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::pop_front(&this->data_queue_);
    return extraout_RAX;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FileReader::read(std::vector<char> &buffer) {
    if (this->can_read()) {
        buffer = data_queue_.front();
        data_queue_.pop_front();
    } else {
        throw ErrorNoData();
    }
}